

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O2

void __thiscall jbcoin::STAmount::set(STAmount *this,int64_t v)

{
  mantissa_type mVar1;
  
  mVar1 = -v;
  if (0 < v) {
    mVar1 = v;
  }
  this->mIsNegative = SUB81((ulong)v >> 0x3f,0);
  this->mValue = mVar1;
  return;
}

Assistant:

void STAmount::set (std::int64_t v)
{
    if (v < 0)
    {
        mIsNegative = true;
        mValue = static_cast<std::uint64_t>(-v);
    }
    else
    {
        mIsNegative = false;
        mValue = static_cast<std::uint64_t>(v);
    }
}